

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

int __thiscall
InitSocket::CbEnumIpAdressen
          (InitSocket *this,int iFamily,string *strIp,int nInterFaceId,void *vpUserParam)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  local_48;
  
  if (vpUserParam == (void *)0x0) {
    iVar3 = 1;
  }
  else {
    pcVar2 = (strIp->_M_dataplus)._M_p;
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + strIp->_M_string_length);
    local_48.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl = iFamily;
    local_48.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
    _M_head_impl = (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)nInterFaceId;
    paVar1 = &local_48.
              super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              .
              super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2;
    if (local_68 == &local_58) {
      local_48.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl.field_2._8_8_ = local_58._8_8_;
      local_48.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_48.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = (pointer)local_68;
    }
    local_48.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
    local_48.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = local_58._M_local_buf[0];
    local_48.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = local_60;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_68 = &local_58;
    std::
    vector<std::tuple<std::__cxx11::string_const,int,int>,std::allocator<std::tuple<std::__cxx11::string_const,int,int>>>
    ::emplace_back<std::tuple<std::__cxx11::string_const,int,int>>
              ((vector<std::tuple<std::__cxx11::string_const,int,int>,std::allocator<std::tuple<std::__cxx11::string_const,int,int>>>
                *)vpUserParam,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.
                      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                      .
                      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_48.
                      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                      .
                      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(local_58._M_allocated_capacity._1_7_,
                                        local_58._M_local_buf[0]) + 1);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int InitSocket::CbEnumIpAdressen(int iFamily, const string& strIp, int nInterFaceId, void* vpUserParam)
{
    if (vpUserParam == nullptr)
        return 1;   // Stop enumeration, doesn't make sense

    vector<tuple<const string, int, int>>* pmaStrIps = static_cast<vector<tuple<const string, int, int>>*>(vpUserParam);
    pmaStrIps->push_back(make_tuple(strIp, iFamily, nInterFaceId));

    return 0;
}